

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  anon_union_120_2_131c4ffb_for_param *firstelem;
  undefined4 uVar1;
  double *pdVar2;
  int iVar3;
  shapeType sVar4;
  SAORegion *pSVar5;
  RgnShape *pRVar6;
  int *piVar7;
  double *pdVar8;
  anon_union_120_2_131c4ffb_for_param *paVar9;
  anon_union_120_2_131c4ffb_for_param *paVar10;
  uint uVar11;
  long lVar12;
  char (*pacVar13) [71];
  char *__s2;
  WCSdata *pWVar14;
  WCSdata *pWVar15;
  char *pcVar16;
  ulong nelem;
  anon_union_120_2_131c4ffb_for_param *array;
  double *pdVar17;
  long *naxes;
  byte bVar18;
  double dVar19;
  double dVar20;
  int anynul;
  double *local_338;
  anon_union_120_2_131c4ffb_for_param *local_330;
  undefined4 local_324;
  RgnShape *local_320;
  WCSdata *local_318;
  SAORegion *local_310;
  double *local_308;
  int *local_300;
  anon_union_120_2_131c4ffb_for_param *local_2f8;
  double local_2f0;
  char *local_2e8;
  double *local_2e0;
  int icol [6];
  double *local_2c0;
  char *cvalue;
  double Ypos;
  double Xpos;
  int local_2a0;
  int tstatus;
  double Y;
  double X;
  RgnShape *local_288;
  double *local_280;
  SAORegion **local_278;
  int idum;
  long icsize [6];
  char comment [73];
  char colname [6] [71];
  
  bVar18 = 0;
  pacVar13 = colname;
  memcpy(pacVar13,&DAT_001de260,0x1aa);
  if (*status != 0) {
    return *status;
  }
  local_278 = Rgn;
  pSVar5 = (SAORegion *)malloc(0x58);
  if (pSVar5 == (SAORegion *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  pSVar5->nShapes = 0;
  pSVar5->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (pSVar5->wcs).exists = 0;
  }
  else {
    pWVar14 = wcs;
    pWVar15 = &pSVar5->wcs;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      uVar1 = *(undefined4 *)&pWVar14->field_0x4;
      pWVar15->exists = pWVar14->exists;
      *(undefined4 *)&pWVar15->field_0x4 = uVar1;
      pWVar14 = (WCSdata *)((long)pWVar14 + (ulong)bVar18 * -0x10 + 8);
      pWVar15 = (WCSdata *)((long)pWVar15 + (ulong)bVar18 * -0x10 + 8);
    }
  }
  tstatus = 0;
  lVar12 = 0;
  local_318 = wcs;
  do {
    ffgcno(fptr,0,*pacVar13,(int *)((long)icol + lVar12),&tstatus);
    lVar12 = lVar12 + 4;
    pacVar13 = pacVar13 + 1;
  } while (lVar12 != 0x14);
  if ((tstatus == 0) || (iVar3 = ffmnhd(fptr,2,"REGION",1,status), iVar3 == 0)) {
    iVar3 = ffgky(fptr,0x1f,"NAXIS2",pSVar5,comment,status);
    if (iVar3 != 0) {
      pcVar16 = "Could not read NAXIS2 keyword.";
      goto LAB_001bab98;
    }
    pRVar6 = (RgnShape *)malloc((long)pSVar5->nShapes * 0xa8);
    pSVar5->Shapes = pRVar6;
    if (pRVar6 != (RgnShape *)0x0) {
      pacVar13 = colname;
      lVar12 = 0;
      pcVar16 = "Could not find column.";
      do {
        iVar3 = ffgcno(fptr,0,*pacVar13,(int *)((long)icol + lVar12),status);
        if (iVar3 != 0) goto LAB_001bab98;
        lVar12 = lVar12 + 4;
        pacVar13 = pacVar13 + 1;
      } while (lVar12 != 0x14);
      local_2a0 = ffgcno(fptr,0,colname[5],icol + 5,status);
      local_324 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_2a0 >> 8),1);
      if ((pSVar5->wcs).exists == 0) {
        local_300 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc(0x48);
        if (piVar7 == (int *)0x0) {
          pcVar16 = "Failed to allocate memory for Region WCS data";
          goto LAB_001bad1e;
        }
        *piVar7 = 1;
        local_320 = (RgnShape *)(piVar7 + 2);
        local_330 = (anon_union_120_2_131c4ffb_for_param *)(piVar7 + 4);
        local_338 = (double *)(piVar7 + 6);
        local_308 = (double *)(piVar7 + 8);
        local_2e0 = (double *)(piVar7 + 10);
        local_2e8 = (char *)(piVar7 + 0xc);
        iVar3 = ffgtcs(fptr,icol[0],icol[1],(double *)local_320,(double *)local_330,local_338,
                       local_308,local_2e0,(double *)local_2e8,(double *)(piVar7 + 0xe),
                       (char *)(piVar7 + 0x10),status);
        local_300 = piVar7;
        if (iVar3 == 0) {
          if (((*piVar7 != 0) && (local_318->exists != 0)) &&
             ((((1e-06 < ABS(*(double *)local_320 - local_318->xrefval) ||
                ((((1e-06 < ABS((local_330->gen).p[0] - local_318->yrefval) ||
                   (1e-06 < ABS(*local_338 - local_318->xrefpix))) ||
                  (1e-06 < ABS(*local_308 - local_318->yrefpix))) ||
                 ((1e-06 < ABS(*local_2e0 - local_318->xinc) ||
                  (1e-06 < ABS(*(double *)local_2e8 - local_318->yinc))))))) ||
               (1e-06 < ABS(*(double *)(piVar7 + 0xe) - local_318->rot))) ||
              (iVar3 = strcmp((char *)(piVar7 + 0x10),local_318->type), iVar3 == 0)))) {
            local_324 = 0;
          }
        }
        else {
          *piVar7 = 0;
          *status = 0;
        }
      }
      naxes = icsize;
      lVar12 = 0;
      do {
        iVar3 = ffgtdm(fptr,icol[lVar12],1,&idum,naxes,status);
        if (iVar3 != 0) {
          pcVar16 = "Could not find vector size of column.";
          goto LAB_001bab98;
        }
        lVar12 = lVar12 + 1;
        naxes = naxes + 1;
      } while (lVar12 != 6);
      cvalue = (char *)malloc(0x48);
      if (0 < pSVar5->nShapes) {
        local_2e0 = (double *)(local_300 + 0x10);
        local_2e8 = local_318->type;
        local_2f0 = 0.0;
        pdVar8 = (double *)0x1;
        local_308 = (double *)0x0;
        local_310 = pSVar5;
        do {
          pRVar6 = pSVar5->Shapes;
          pdVar17 = pRVar6[(long)pdVar8 + -1].param.gen.p + 6;
          *pdVar17 = 0.0;
          pdVar17[1] = 0.0;
          pdVar17 = pRVar6[(long)pdVar8 + -1].param.gen.p + 4;
          *pdVar17 = 0.0;
          pdVar17[1] = 0.0;
          pdVar17 = pRVar6[(long)pdVar8 + -1].param.gen.p + 2;
          *pdVar17 = 0.0;
          pdVar17[1] = 0.0;
          pRVar6[(long)pdVar8 + -1].param.gen.p[0] = 0.0;
          *(undefined8 *)((long)&pRVar6[(long)pdVar8 + -1].param + 8) = 0;
          pdVar17 = &pRVar6[(long)pdVar8 + -1].param.gen.sinT;
          *pdVar17 = 0.0;
          pdVar17[1] = 0.0;
          pdVar17 = &pRVar6[(long)pdVar8 + -1].param.gen.a;
          *pdVar17 = 0.0;
          pdVar17[1] = 0.0;
          local_338 = pdVar8;
          iVar3 = ffgcvs(fptr,icol[2],(LONGLONG)pdVar8,1,1," ",&cvalue,&anynul,status);
          if (iVar3 != 0) {
            pcVar16 = "Could not read shape.";
            goto LAB_001bab98;
          }
          local_288 = pRVar6 + (long)pdVar8 + -1;
          local_288->sign = '\x01';
          pcVar16 = cvalue;
          if (*cvalue == '!') {
            local_288->sign = '\0';
            pcVar16 = cvalue + 1;
          }
          local_320 = pRVar6 + (long)pdVar8;
          local_2f8 = &pRVar6[(long)pdVar8 + -1].param;
          __s2 = "POINT";
          lVar12 = 0;
          do {
            iVar3 = strcmp(pcVar16,__s2);
            pRVar6 = local_320;
            if (iVar3 == 0) {
              local_320[-1].shape = *(shapeType *)((long)&DAT_001de8d0 + lVar12);
            }
            lVar12 = lVar12 + 4;
            __s2 = __s2 + 0x47;
          } while (lVar12 != 0x44);
          if (local_320[-1].shape == poly_rgn) {
            paVar9 = (anon_union_120_2_131c4ffb_for_param *)
                     calloc(CONCAT44(icsize[0]._4_4_,(int)icsize[0]) * 2,8);
            pRVar6[-1].param.poly.Pts = (double *)paVar9;
            if (paVar9 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
              pcVar16 = "Could not allocate memory to hold polygon parameters";
              goto LAB_001bad1e;
            }
            (local_2f8->poly).nPts = (int)icsize[0] * 2;
            uVar11 = (int)icsize[0] * 2 >> 1;
            local_2c0 = (double *)(ulong)uVar11;
            pWVar14 = local_318;
            pdVar17 = local_338;
            if (0 < (int)uVar11) goto LAB_001baf6a;
          }
          else {
            local_2c0 = (double *)(ulong)((local_320[-1].shape == rectangle_rgn) + 1);
            paVar9 = local_2f8;
LAB_001baf6a:
            pWVar14 = local_318;
            paVar10 = (anon_union_120_2_131c4ffb_for_param *)0x0;
            array = paVar9;
            local_280 = local_2c0;
            do {
              pdVar17 = local_338;
              firstelem = (anon_union_120_2_131c4ffb_for_param *)((long)paVar10 + 1);
              local_330 = paVar10;
              iVar3 = ffgcvd(fptr,icol[0],(LONGLONG)local_338,(LONGLONG)firstelem,1,
                             -9.1191291391491e-36,(double *)array,&anynul,status);
              if (iVar3 != 0) {
                pcVar16 = "Failed to read X column for polygon region";
                pSVar5 = local_310;
                goto LAB_001bab98;
              }
              paVar9 = array;
              if (((array->gen).p[0] == -9.1191291391491e-36) &&
                 (paVar10 = local_330, !NAN((array->gen).p[0]))) {
LAB_001bb0b4:
                (local_2f8->poly).nPts = (int)paVar10 * 2;
                local_2c0 = (double *)((ulong)paVar10 & 0xffffffff);
                pSVar5 = local_310;
                break;
              }
              iVar3 = ffgcvd(fptr,icol[1],(LONGLONG)pdVar17,(LONGLONG)firstelem,1,
                             -9.1191291391491e-36,(double *)((long)array + 8),&anynul,status);
              pSVar5 = local_310;
              if (iVar3 != 0) {
                pcVar16 = "Failed to read Y column for polygon region";
                goto LAB_001bab98;
              }
              dVar19 = *(double *)((long)array + 8);
              pdVar17 = local_338;
              if ((dVar19 == -9.1191291391491e-36) && (paVar10 = local_330, !NAN(dVar19)))
              goto LAB_001bb0b4;
              paVar9 = (anon_union_120_2_131c4ffb_for_param *)((long)array + 0x10);
              pdVar8 = (double *)(array->gen).p[0];
              pdVar2 = pdVar8;
              dVar20 = dVar19;
              if (local_330 != (anon_union_120_2_131c4ffb_for_param *)0x0) {
                pdVar2 = local_308;
                dVar20 = local_2f0;
                if (((double)local_308 == (double)pdVar8) &&
                   (!NAN((double)local_308) && !NAN((double)pdVar8))) {
                  if ((local_2f0 == dVar19) &&
                     (paVar10 = firstelem, !NAN(local_2f0) && !NAN(dVar19))) goto LAB_001bb0b4;
                }
              }
              local_2f0 = dVar20;
              local_308 = pdVar2;
              paVar10 = firstelem;
              array = paVar9;
            } while ((anon_union_120_2_131c4ffb_for_param *)local_280 != firstelem);
          }
          if ((char)local_324 == '\0') {
            pdVar8 = (double *)((long)paVar9 + (long)((int)local_2c0 * 2) * -8);
            local_308 = (double *)*pdVar8;
            local_2f0 = pdVar8[1];
            pdVar17 = local_338;
            if (0 < (int)local_2c0) {
              pdVar8 = pdVar8 + 1;
              local_330 = paVar9;
              do {
                ffwldp(pdVar8[-1],*pdVar8,*(double *)(local_300 + 2),*(double *)(local_300 + 4),
                       *(double *)(local_300 + 6),*(double *)(local_300 + 8),
                       *(double *)(local_300 + 10),*(double *)(local_300 + 0xc),
                       *(double *)(local_300 + 0xe),(char *)local_2e0,&Xpos,&Ypos,status);
                ffxypx(Xpos,Ypos,local_318->xrefval,local_318->yrefval,local_318->xrefpix,
                       local_318->yrefpix,local_318->xinc,local_318->yinc,local_318->rot,local_2e8,
                       pdVar8 + -1,pdVar8,status);
                if (*status != 0) goto LAB_001bb64f;
                pdVar8 = pdVar8 + 2;
                local_2c0 = (double *)((long)local_2c0 + -1);
                pWVar14 = local_318;
                paVar9 = local_330;
                pdVar17 = local_338;
              } while (local_2c0 != (double *)0x0);
            }
          }
          sVar4 = local_320[-1].shape;
          uVar11 = sVar4 - circle_rgn;
          if ((uVar11 < 9) && ((0x1bfU >> (uVar11 & 0x1f) & 1) != 0)) {
            nelem = (ulong)*(uint *)(&DAT_001de914 + (ulong)uVar11 * 4);
            iVar3 = ffgcvd(fptr,icol[3],(LONGLONG)pdVar17,1,nelem,0.0,(double *)paVar9,&anynul,
                           status);
            if (iVar3 != 0) {
              pcVar16 = "Failed to read R column for region";
              goto LAB_001bab98;
            }
            if ((char)local_324 == '\0') {
              do {
                Y = (paVar9->gen).p[0] + local_2f0;
                X = (double)local_308;
                ffwldp((double)local_308,Y,*(double *)(local_300 + 2),*(double *)(local_300 + 4),
                       *(double *)(local_300 + 6),*(double *)(local_300 + 8),
                       *(double *)(local_300 + 10),*(double *)(local_300 + 0xc),
                       *(double *)(local_300 + 0xe),(char *)local_2e0,&Xpos,&Ypos,status);
                ffxypx(Xpos,Ypos,local_318->xrefval,local_318->yrefval,local_318->xrefpix,
                       local_318->yrefpix,local_318->xinc,local_318->yinc,local_318->rot,local_2e8,
                       &X,&Y,status);
                if (*status != 0) goto LAB_001bb64f;
                dVar19 = X - (local_2f8->gen).p[0];
                dVar20 = Y - *(double *)((long)local_2f8 + 8);
                (paVar9->gen).p[0] = SQRT(dVar20 * dVar20 + dVar19 * dVar19);
                paVar9 = (anon_union_120_2_131c4ffb_for_param *)((long)paVar9 + 8);
                uVar11 = (int)nelem - 1;
                nelem = (ulong)uVar11;
              } while (uVar11 != 0);
            }
            else {
              paVar9 = (anon_union_120_2_131c4ffb_for_param *)((long)paVar9 + nelem * 8);
            }
            sVar4 = local_320[-1].shape;
            pWVar14 = local_318;
          }
          uVar11 = sVar4 - ellipse_rgn;
          if ((uVar11 < 7) && ((0x6fU >> (uVar11 & 0x1f) & 1) != 0)) {
            uVar11 = *(uint *)(&DAT_001de938 + (ulong)uVar11 * 4);
            local_330 = paVar9;
            iVar3 = ffgcvd(fptr,icol[4],(LONGLONG)pdVar17,1,(ulong)uVar11,0.0,(double *)paVar9,
                           &anynul,status);
            if (iVar3 != 0) {
              pcVar16 = "Failed to read ROTANG column for region";
              goto LAB_001bab98;
            }
            if ((char)local_324 == '\0') {
              dVar19 = pWVar14->rot;
              dVar20 = *(double *)(local_300 + 0xe);
              lVar12 = 0;
              do {
                *(double *)((long)local_330 + lVar12 * 8) =
                     *(double *)((long)local_330 + lVar12 * 8) + (dVar19 - dVar20);
                lVar12 = lVar12 + 1;
              } while (uVar11 != (uint)lVar12);
            }
          }
          if (local_2a0 == 0) {
            iVar3 = ffgcv(fptr,0x1f,icol[5],(LONGLONG)pdVar17,1,1,(void *)0x0,&local_320[-1].comp,
                          &anynul,status);
            if (iVar3 != 0) {
              pcVar16 = "Failed to read COMPONENT column for region";
              goto LAB_001bab98;
            }
          }
          else {
            local_320[-1].comp = 1;
          }
          fits_setup_shape(local_288);
          pdVar8 = (double *)((long)pdVar17 + 1);
        } while ((long)pdVar17 < (long)pSVar5->nShapes);
      }
      goto LAB_001bab9d;
    }
    pcVar16 = "Failed to allocate memory for Region data";
LAB_001bad1e:
    ffpmsg(pcVar16);
    *status = 0x71;
  }
  else {
    pcVar16 = "Could not move to REGION extension.";
LAB_001bab98:
    ffpmsg(pcVar16);
LAB_001bab9d:
    if (*status == 0) {
      *local_278 = pSVar5;
      goto LAB_001babd0;
    }
  }
  fits_free_region(pSVar5);
LAB_001babd0:
  ffclos(fptr,status);
  return *status;
LAB_001bb64f:
  pcVar16 = "Failed to transform coordinates";
  goto LAB_001bab98;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}